

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O2

bool __thiscall SchemeInt::is_eq(SchemeInt *this,shared_ptr<SchemeObject> *a)

{
  bool bVar1;
  shared_ptr<SchemeInt> p;
  shared_ptr<SchemeObject> local_20;
  
  std::dynamic_pointer_cast<SchemeInt,SchemeObject>(&local_20);
  if (local_20.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    bVar1 = false;
  }
  else {
    bVar1 = (_func_int **)this->value ==
            local_20.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
            _vptr_SchemeObject;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return bVar1;
}

Assistant:

bool SchemeInt::is_eq(const std::shared_ptr<SchemeObject> &a) const
{
    auto p = std::dynamic_pointer_cast<SchemeInt>(a);
    return p && value == p->value;
}